

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

_Bool ext_ml_model_decision_after_part_ab
                (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int part_ctx,int64_t best_rd,
                int64_t (*rect_part_rd) [2],int64_t *split_rd,int *partition_horz4_allowed,
                int *partition_vert4_allowed,uint pb_source_variance,int mi_row,int mi_col)

{
  _Bool _Var1;
  int iVar2;
  long in_RDI;
  undefined4 *in_stack_00000010;
  undefined4 *in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000028;
  _Bool valid_decision;
  aom_partition_decision_t decision;
  aom_partition_features_t features;
  ExtPartController *ext_part_controller;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffd454;
  undefined4 in_stack_ffffffffffffd45c;
  int64_t (*in_stack_ffffffffffffd560) [2];
  int64_t in_stack_ffffffffffffd568;
  int in_stack_ffffffffffffd570;
  BLOCK_SIZE in_stack_ffffffffffffd577;
  MACROBLOCK *in_stack_ffffffffffffd578;
  AV1_COMP *in_stack_ffffffffffffd580;
  int64_t *in_stack_ffffffffffffd590;
  uint in_stack_ffffffffffffd598;
  int in_stack_ffffffffffffd5a0;
  int in_stack_ffffffffffffd5a8;
  aom_partition_features_t *in_stack_ffffffffffffd5b0;
  undefined4 local_b50;
  undefined4 local_b4c;
  undefined1 local_11;
  
  iVar2 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
  if ((iVar2 == 0) && (*(int *)(in_RDI + 0x9d528) != 0)) {
    prepare_features_after_part_ab
              (in_stack_ffffffffffffd580,in_stack_ffffffffffffd578,in_stack_ffffffffffffd577,
               in_stack_ffffffffffffd570,in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
               in_stack_ffffffffffffd590,in_stack_ffffffffffffd598,in_stack_ffffffffffffd5a0,
               in_stack_ffffffffffffd5a8,in_stack_ffffffffffffd5b0);
    av1_ext_part_send_features
              ((ExtPartController *)CONCAT44(in_stack_ffffffffffffd45c,in_stack_00000028),
               (aom_partition_features_t *)CONCAT44(in_stack_ffffffffffffd454,in_stack_00000020));
    _Var1 = av1_ext_part_get_partition_decision
                      ((ExtPartController *)CONCAT44(in_stack_ffffffffffffd45c,in_stack_00000028),
                       (aom_partition_decision_t *)
                       CONCAT44(in_stack_ffffffffffffd454,in_stack_00000020));
    if (_Var1) {
      *in_stack_00000010 = local_b50;
      *in_stack_00000018 = local_b4c;
      local_11 = true;
    }
    else {
      local_11 = false;
    }
  }
  else {
    local_11 = false;
  }
  return local_11;
}

Assistant:

static bool ext_ml_model_decision_after_part_ab(
    AV1_COMP *const cpi, MACROBLOCK *const x, BLOCK_SIZE bsize, int part_ctx,
    int64_t best_rd, int64_t rect_part_rd[NUM_RECT_PARTS][SUB_PARTITIONS_RECT],
    int64_t split_rd[SUB_PARTITIONS_SPLIT], int *const partition_horz4_allowed,
    int *const partition_vert4_allowed, unsigned int pb_source_variance,
    int mi_row, int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  ExtPartController *const ext_part_controller = &cpi->ext_part_controller;

  if (!frame_is_intra_only(cm) && ext_part_controller->ready) {
    // Setup features.
    aom_partition_features_t features;
    features.id = AOM_EXT_PART_FEATURE_AFTER_AB;
    prepare_features_after_part_ab(cpi, x, bsize, part_ctx, best_rd,
                                   rect_part_rd, split_rd, pb_source_variance,
                                   mi_row, mi_col, &features);

    // Send necessary features to the external model.
    av1_ext_part_send_features(ext_part_controller, &features);

    // Get partition decisions from the external model.
    aom_partition_decision_t decision;
    const bool valid_decision =
        av1_ext_part_get_partition_decision(ext_part_controller, &decision);
    if (!valid_decision) return false;

    // Populate decisions
    *partition_horz4_allowed = decision.partition_horz4_allowed;
    *partition_vert4_allowed = decision.partition_vert4_allowed;

    return true;
  }

  return false;
}